

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCaseInfo *testInfo)

{
  set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
  *this_00;
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  ostream *poVar4;
  ostringstream oss;
  string local_288;
  TestCaseInfo local_268;
  SourceLineInfo local_1a0 [2];
  ios_base local_130 [264];
  
  iVar2 = std::__cxx11::string::compare((char *)&testInfo->m_name);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(testInfo->m_name)._M_dataplus._M_p,
                        (testInfo->m_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"unnamed/",8);
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    TestCaseInfo::TestCaseInfo(&local_268,testInfo,&local_288);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_268);
    TestCaseInfo::~TestCaseInfo(&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    this_00 = &this->m_functions;
    iVar3 = std::
            _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
            ::find(&this_00->_M_t,testInfo);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_functions)._M_t._M_impl.super__Rb_tree_header)
    {
      iVar3 = std::
              _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
              ::find(&this_00->_M_t,testInfo);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: TEST_CASE( \"",0x13);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(testInfo->m_name)._M_dataplus._M_p,
                          (testInfo->m_name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" ) already defined.\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tFirst seen at ",0xf);
      local_1a0[0].file._M_dataplus._M_p = (pointer)&local_1a0[0].file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,iVar3._M_node[5]._M_right,
                 (long)&(iVar3._M_node[5]._M_right)->_M_color + *(long *)(iVar3._M_node + 6));
      local_1a0[0].line = (size_t)iVar3._M_node[6]._M_right;
      poVar4 = operator<<(poVar4,local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tRedefined at ",0xe);
      local_268.m_test.m_p = (ITestCase *)&local_268.m_className._M_string_length;
      pcVar1 = (testInfo->m_lineInfo).file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,pcVar1,pcVar1 + (testInfo->m_lineInfo).file._M_string_length);
      local_268.m_className.field_2._8_8_ = (testInfo->m_lineInfo).line;
      poVar4 = operator<<(poVar4,(SourceLineInfo *)&local_268);
      std::endl<char,std::char_traits<char>>(poVar4);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&local_268);
      SourceLineInfo::~SourceLineInfo(local_1a0);
      exit(1);
    }
    std::
    _Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
    ::_M_insert_unique<Catch::TestCaseInfo_const&>
              ((_Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
                *)this_00,testInfo);
    std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
              (&this->m_functionsInOrder,testInfo);
    if (testInfo->m_isHidden == false) {
      std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
                (&this->m_nonHiddenFunctions,testInfo);
      return;
    }
  }
  return;
}

Assistant:

virtual void registerTest( const TestCaseInfo& testInfo ) {
            if( testInfo.getName() == "" ) {
                std::ostringstream oss;
                oss << testInfo.getName() << "unnamed/" << ++m_unnamedCount;
                return registerTest( TestCaseInfo( testInfo, oss.str() ) );
            }

            if( m_functions.find( testInfo ) == m_functions.end() ) {
                m_functions.insert( testInfo );
                m_functionsInOrder.push_back( testInfo );
                if( !testInfo.isHidden() )
                    m_nonHiddenFunctions.push_back( testInfo );
            }
            else {
                const TestCaseInfo& prev = *m_functions.find( testInfo );
                std::cerr   << "error: TEST_CASE( \"" << testInfo.getName() << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getLineInfo() ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testInfo.getLineInfo() ) << std::endl;
                exit(1);
            }
        }